

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.h
# Opt level: O0

cmCommand * __thiscall cmDefinePropertyCommand::Clone(cmDefinePropertyCommand *this)

{
  cmDefinePropertyCommand *this_00;
  cmDefinePropertyCommand *this_local;
  
  this_00 = (cmDefinePropertyCommand *)operator_new(0x90);
  cmDefinePropertyCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmDefinePropertyCommand; }